

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O1

bool dxil_spv::extract_raw_buffer_access_split
               (Value *index,uint stride,uint32_t addr_shift_log2,uint vecsize,
               RawBufferAccessSplit *split)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  ValueKind VVar4;
  BinaryOps BVar5;
  Constant *pCVar6;
  APInt *pAVar7;
  int64_t iVar8;
  Value *pVVar9;
  BinaryOperator *this;
  Value *value;
  Constant *pCVar10;
  ulong uVar11;
  LoggingCallback p_Var12;
  void *pvVar13;
  byte bVar14;
  uint64_t uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  char local_1038 [4104];
  
  bVar14 = (byte)addr_shift_log2;
  uVar16 = vecsize << (bVar14 & 0x1f);
  if (index == (Value *)0x0) {
    pCVar10 = (Constant *)0x0;
  }
  else {
    pCVar6 = (Constant *)LLVMBC::Internal::resolve_proxy(index);
    VVar4 = LLVMBC::Value::get_value_kind((Value *)pCVar6);
    pCVar10 = (Constant *)0x0;
    if (VVar4 == ConstantInt) {
      pCVar10 = pCVar6;
    }
  }
  if (pCVar10 != (Constant *)0x0) {
    pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar10);
    iVar8 = LLVMBC::APInt::getSExtValue(pAVar7);
    if ((vecsize == 1) || ((long)((ulong)stride * iVar8) % (long)(int)uVar16 == 0)) {
      split->scale = 0;
      split->bias = 0;
      split->dynamic_index = (Value *)0x0;
      split->bias = (long)((ulong)stride * iVar8) / (long)(ulong)uVar16;
      bVar14 = 1;
    }
    else {
      bVar14 = 0;
    }
  }
  if (pCVar10 != (Constant *)0x0) goto LAB_0014ed55;
  bVar20 = false;
  bVar2 = false;
  bVar1 = false;
  pCVar10 = (Constant *)0x0;
  pCVar6 = (Constant *)0x0;
  do {
    value = index;
    if (pCVar6 != (Constant *)0x0) break;
    pVVar9 = LLVMBC::Internal::resolve_proxy(index);
    VVar4 = LLVMBC::Value::get_value_kind(pVVar9);
    if (VVar4 != BinaryOperator) {
      pCVar6 = (Constant *)0x0;
      break;
    }
    this = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(index);
    VVar4 = LLVMBC::Value::get_value_kind((Value *)this);
    if (VVar4 != BinaryOperator) {
      p_Var12 = get_thread_log_callback();
      if (p_Var12 == (LoggingCallback)0x0) {
        extract_raw_buffer_access_split();
        std::terminate();
      }
      builtin_strncpy(local_1038 + 0x10,"in cast<T>.\n",0xd);
      builtin_strncpy(local_1038,"Invalid type ID ",0x10);
      pvVar13 = get_thread_log_callback_userdata();
      (*p_Var12)(pvVar13,Error,local_1038);
      std::terminate();
    }
    pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)this,0);
    value = LLVMBC::Instruction::getOperand((Instruction *)this,1);
    if ((pCVar10 == (Constant *)0x0) &&
       ((((BVar5 = LLVMBC::BinaryOperator::getOpcode(this), BVar5 == Add ||
          (BVar5 = LLVMBC::BinaryOperator::getOpcode(this), BVar5 == Sub)) ||
         (BVar5 = LLVMBC::BinaryOperator::getOpcode(this), BVar5 == Or)) ||
        (BVar5 = LLVMBC::BinaryOperator::getOpcode(this), BVar5 == Xor)))) {
      if (pVVar9 == (Value *)0x0) {
        pCVar10 = (Constant *)0x0;
      }
      else {
        pCVar10 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar9);
        VVar4 = LLVMBC::Value::get_value_kind((Value *)pCVar10);
        if (VVar4 != ConstantInt) {
          pCVar10 = (Constant *)0x0;
        }
      }
      cVar3 = '\0';
      if (pCVar10 == (Constant *)0x0) {
        if (value == (Value *)0x0) {
          pCVar10 = (Constant *)0x0;
        }
        else {
          pCVar10 = (Constant *)LLVMBC::Internal::resolve_proxy(value);
          VVar4 = LLVMBC::Value::get_value_kind((Value *)pCVar10);
          if (VVar4 != ConstantInt) {
            pCVar10 = (Constant *)0x0;
          }
        }
        value = pVVar9;
        if (pCVar10 == (Constant *)0x0) {
          value = index;
        }
        cVar3 = (pCVar10 == (Constant *)0x0) * '\x03';
      }
      if (cVar3 == '\0') {
        BVar5 = LLVMBC::BinaryOperator::getOpcode(this);
        bVar20 = BVar5 == Sub;
        BVar5 = LLVMBC::BinaryOperator::getOpcode(this);
        bVar2 = BVar5 == Add || bVar20;
        pCVar6 = (Constant *)0x0;
LAB_0014efdb:
        cVar3 = '\0';
      }
      else {
        pCVar6 = (Constant *)0x0;
      }
    }
    else {
      BVar5 = LLVMBC::BinaryOperator::getOpcode(this);
      if (BVar5 == Shl) {
        if (value == (Value *)0x0) {
          pCVar6 = (Constant *)0x0;
        }
        else {
          pCVar6 = (Constant *)LLVMBC::Internal::resolve_proxy(value);
          VVar4 = LLVMBC::Value::get_value_kind((Value *)pCVar6);
          if (VVar4 != ConstantInt) {
            pCVar6 = (Constant *)0x0;
          }
        }
        if (pCVar6 != (Constant *)0x0) {
          bVar1 = true;
          value = pVVar9;
          goto LAB_0014efdb;
        }
        cVar3 = (pCVar6 == (Constant *)0x0) * '\x03';
        value = index;
      }
      else {
        BVar5 = LLVMBC::BinaryOperator::getOpcode(this);
        if (BVar5 == Mul) {
          if (pVVar9 == (Value *)0x0) {
            pCVar6 = (Constant *)0x0;
          }
          else {
            pCVar6 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar9);
            VVar4 = LLVMBC::Value::get_value_kind((Value *)pCVar6);
            if (VVar4 != ConstantInt) {
              pCVar6 = (Constant *)0x0;
            }
          }
          cVar3 = '\0';
          if (pCVar6 == (Constant *)0x0) {
            if (value == (Value *)0x0) {
              pCVar6 = (Constant *)0x0;
            }
            else {
              pCVar6 = (Constant *)LLVMBC::Internal::resolve_proxy(value);
              VVar4 = LLVMBC::Value::get_value_kind((Value *)pCVar6);
              if (VVar4 != ConstantInt) {
                pCVar6 = (Constant *)0x0;
              }
            }
            value = pVVar9;
            if (pCVar6 == (Constant *)0x0) {
              value = index;
            }
            cVar3 = (pCVar6 == (Constant *)0x0) * '\x03';
          }
          if (cVar3 == '\0') {
            bVar1 = false;
            goto LAB_0014efdb;
          }
        }
        else {
          cVar3 = '\x03';
          pCVar6 = (Constant *)0x0;
          value = index;
        }
      }
    }
    index = value;
  } while (cVar3 == '\0');
  if (pCVar6 == (Constant *)0x0 && pCVar10 == (Constant *)0x0) {
    bVar14 = 0;
    if (stride % uVar16 != 0) goto LAB_0014ed55;
    split->scale = 0;
    split->bias = 0;
    split->dynamic_index = (Value *)0x0;
    split->scale = (ulong)stride / (ulong)uVar16;
  }
  else {
    uVar15 = 1;
    if (pCVar6 != (Constant *)0x0) {
      pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
      uVar15 = LLVMBC::APInt::getZExtValue(pAVar7);
    }
    uVar19 = 1L << ((byte)uVar15 & 0x3f);
    if (!bVar1) {
      uVar19 = uVar15;
    }
    if (pCVar10 == (Constant *)0x0) {
      uVar11 = 0;
    }
    else {
      pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar10);
      uVar11 = LLVMBC::APInt::getSExtValue(pAVar7);
    }
    uVar17 = -uVar11;
    if (!bVar20) {
      uVar17 = uVar11;
    }
    if ((!bVar2) && ((uVar17 & uVar19) != 0)) {
      bVar14 = 0;
      goto LAB_0014ed55;
    }
    uVar19 = uVar19 * stride;
    uVar11 = (ulong)uVar16;
    bVar14 = 0;
    if (uVar19 % uVar11 != 0) goto LAB_0014ed55;
    lVar18 = uVar17 * stride;
    bVar14 = 0;
    if ((lVar18 % (long)uVar11 != 0) || (bVar14 = 0, value == (Value *)0x0)) goto LAB_0014ed55;
    split->scale = uVar19 / uVar11;
    split->bias = lVar18 / (long)(int)uVar16;
  }
  split->dynamic_index = value;
  bVar14 = 1;
LAB_0014ed55:
  return (bool)(bVar14 & 1);
}

Assistant:

bool extract_raw_buffer_access_split(const llvm::Value *index, unsigned stride,
                                     uint32_t addr_shift_log2, unsigned vecsize,
                                     RawBufferAccessSplit &split)
{
	unsigned element_size = (1u << addr_shift_log2) * vecsize;

	// Base case first, a constant value.
	if (const auto *const_addr = llvm::dyn_cast<llvm::ConstantInt>(index))
	{
		int64_t constant_offset = const_addr->getUniqueInteger().getSExtValue();
		constant_offset *= stride;

		// Always pass scalar constant dividers through.
		// Building a fallback divider helps nothing.
		if (vecsize == 1 || constant_offset % int(element_size) == 0)
		{
			split = {};
			split.bias = constant_offset / element_size;
			return true;
		}
		else
			return false;
	}

	const llvm::ConstantInt *scale = nullptr;
	const llvm::ConstantInt *bias = nullptr;
	bool scale_log2 = false;
	bool bias_is_add = false;
	bool bias_negate = false;

	while (!scale && llvm::isa<llvm::BinaryOperator>(index))
	{
		auto *binop = llvm::cast<llvm::BinaryOperator>(index);
		auto *lhs = binop->getOperand(0);
		auto *rhs = binop->getOperand(1);
		if (!bias && (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Sub ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Or ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Xor))
		{
			if (const auto *const_lhs = llvm::dyn_cast<llvm::ConstantInt>(lhs))
			{
				bias = const_lhs;
				index = rhs;
			}
			else if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				bias = const_rhs;
				index = lhs;
			}
			else
				break;

			// DXC tends to be emit shift + or in some cases.
			// We can turn this back into mul + add in most cases.
			bias_negate = binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Sub;
			bias_is_add =
					binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add ||
					bias_negate;
		}
		else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Shl)
		{
			if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				scale = const_rhs;
				index = lhs;
			}
			else
				break;

			scale_log2 = true;
		}
		else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Mul)
		{
			if (const auto *const_lhs = llvm::dyn_cast<llvm::ConstantInt>(lhs))
			{
				scale = const_lhs;
				index = rhs;
			}
			else if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				scale = const_rhs;
				index = lhs;
			}
			else
				break;

			scale_log2 = false;
		}
		else
			break;
	}

	if (!scale && !bias)
	{
		// We cannot split anything, but we might be able to vectorize if the stride alone carries us.
		if (stride % element_size == 0)
		{
			split = {};
			split.scale = stride / element_size;
			split.dynamic_index = index;
			return true;
		}
		else
			return false;
	}

	uint64_t scale_factor = 1;
	if (scale)
		scale_factor = scale->getUniqueInteger().getZExtValue();
	if (scale_log2)
		scale_factor = 1ull << scale_factor;

	int64_t bias_factor = 0;
	if (bias)
		bias_factor = bias->getUniqueInteger().getSExtValue();
	if (bias_negate)
		bias_factor = -bias_factor;

	// If there is no bit overlap between scale_factor and bias_factor
	// then the bitwise OR is equivalent to add.
	if (!bias_is_add && (scale_factor & bias_factor) != 0)
		return false;

	scale_factor *= stride;
	bias_factor *= stride;

	if (scale_factor % element_size == 0 && bias_factor % element_size == 0 && index)
	{
		split.scale = scale_factor / element_size;
		split.bias = bias_factor / int(element_size);
		split.dynamic_index = index;
		return true;
	}
	else
		return false;
}